

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int processCommandLine(int argc,char **argv,opt_t *opt)

{
  char *pcVar1;
  char *pcVar2;
  undefined4 uVar3;
  size_type *psVar4;
  opt_t *poVar5;
  int longIndex;
  undefined4 local_8c;
  char **local_88;
  size_type *local_80;
  opt_t *local_78;
  size_type *local_70;
  opt_t *local_68;
  size_type *local_60;
  opt_t *local_58;
  size_type *local_50;
  opt_t *local_48;
  size_type *local_40;
  opt_t *local_38;
  
  local_8c = 0;
  local_38 = (opt_t *)&opt->target;
  local_40 = &(opt->target)._M_string_length;
  local_48 = (opt_t *)&opt->effect;
  local_50 = &(opt->effect)._M_string_length;
  local_58 = (opt_t *)&opt->detector;
  local_60 = &(opt->detector)._M_string_length;
  local_68 = (opt_t *)&opt->image;
  local_70 = &(opt->image)._M_string_length;
  local_78 = (opt_t *)&opt->video;
  local_80 = &(opt->video)._M_string_length;
  local_88 = argv;
  do {
    uVar3 = getopt_long_only(argc,local_88,"",processCommandLine::s_longOptions,&local_8c);
    pcVar2 = _optarg;
    psVar4 = &(opt->filePath)._M_string_length;
    poVar5 = opt;
    switch(uVar3) {
    case 1:
      break;
    case 2:
      psVar4 = local_80;
      poVar5 = local_78;
      break;
    case 3:
      psVar4 = local_70;
      poVar5 = local_68;
      break;
    case 4:
      psVar4 = local_60;
      poVar5 = local_58;
      break;
    case 5:
      psVar4 = local_50;
      poVar5 = local_48;
      break;
    case 6:
      psVar4 = local_40;
      poVar5 = local_38;
      break;
    case 0xffffffff:
      return 0;
    default:
      processCommandLine();
    case 0:
      showHelp();
      exit(0);
    }
    pcVar1 = (char *)*psVar4;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)poVar5,0,pcVar1,(ulong)pcVar2);
  } while( true );
}

Assistant:

int processCommandLine(int argc, char** argv, opt_t &opt) 
{
    enum OPTIONS 
    {
        OPT_HELP = 0,
        OPT_IN_FILE,
        OPT_OUT_VIDEO,
        OPT_OUT_IMAGE,
        OPT_DETECTOR,
        OPT_EFFECT,
        OPT_TARGET
    };

    const int noArgument = 0;
    const int requiredArgument = 1;

    static struct option s_longOptions[] = 
    {
            {"help",             noArgument,       NULL, OPT_HELP},
            {"file",             requiredArgument, NULL, OPT_IN_FILE},
            {"video",            requiredArgument, NULL, OPT_OUT_VIDEO},
            {"image",            requiredArgument, NULL, OPT_OUT_IMAGE},
            {"detector",         requiredArgument, NULL, OPT_DETECTOR},
            {"effect",           requiredArgument, NULL, OPT_EFFECT},
            {"target",           requiredArgument, NULL, OPT_TARGET},
            {NULL, 0, NULL, 0}
    };

    int longIndex = 0;
    int opt_idx = 0;

    while ((opt_idx = getopt_long_only(argc, argv, "", s_longOptions, &longIndex)) != -1) 
    {
        switch (opt_idx) 
        {
            case OPT_HELP:
                showHelp();
                std::exit(0);
            case OPT_IN_FILE:
                opt.filePath = optarg;
                break;
            case OPT_OUT_VIDEO:
                opt.video = optarg;
                break;
            case OPT_OUT_IMAGE:
                opt.image = optarg;
                break;
            case OPT_DETECTOR:
                opt.detector = optarg;
                break;
            case OPT_EFFECT:
                opt.effect = optarg;
                break;
            case OPT_TARGET:
                opt.target = optarg;
                break;
            default:
                fprintf(stderr, "Invalid argument passed: %s", argv[optind - 1]);
                showHelp();
                std::exit(-1);
        }
    }

    return 0;
}